

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetRepeatedString_abi_cxx11_
          (string *__return_storage_ptr__,GeneratedMessageReflection *this,Message *message,
          FieldDescriptor *field,int index)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int number;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  string *psVar5;
  FieldOptions *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  int index_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedString","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedString",
               "Field is singular; the method requires a repeated field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetRepeatedString",CPPTYPE_STRING);
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = GetExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    psVar5 = ExtensionSet::GetRepeatedString_abi_cxx11_(this_00,number,index);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar5);
  }
  else {
    this_01 = FieldDescriptor::options(field);
    FieldOptions::ctype(this_01);
    pbVar6 = GetRepeatedPtrField<std::__cxx11::string>(this,message,field,index);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

string GeneratedMessageReflection::GetRepeatedString(
    const Message& message, const FieldDescriptor* field, int index) const {
  USAGE_CHECK_ALL(GetRepeatedString, REPEATED, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRepeatedString(field->number(), index);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING:
        return GetRepeatedPtrField<string>(message, field, index);
    }

    GOOGLE_LOG(FATAL) << "Can't get here.";
    return kEmptyString;  // Make compiler happy.
  }
}